

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O2

void __thiscall
rtb::Filter::Filter<double>::setTransferFunction(Filter<double> *this,TransferFunction<double> *tf)

{
  size_t sVar1;
  size_type __new_size;
  
  TransferFunction<double>::operator=(&this->tf_,tf);
  sVar1 = (this->tf_).numerator_.size_;
  __new_size = (this->tf_).denominator_.size_;
  this->n_ = __new_size;
  this->m_ = sVar1;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
            (&this->y_,__new_size);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
            (&this->x_,this->m_);
  resetState(this);
  return;
}

Assistant:

void Filter<T>::setTransferFunction(const TransferFunction<T>& tf) {
            tf_ = tf;
            n_ = tf_.getDenominatorSize();
            m_ = tf_.getNumeratorSize();
            y_.resize(n_);
            x_.resize(m_);
            resetState();
        }